

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
DeleteProperty_Internal<true>
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  byte bVar1;
  ScriptContext *scriptContext;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  uint uVar4;
  PropertyOperationFlags PVar5;
  bool bVar6;
  uint32 index;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *this_00;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *pSVar10;
  Type *pTVar11;
  byte bVar12;
  ScriptContext *this_01;
  PropertyRecord *local_48;
  SimpleDictionaryPropertyDescriptor<int> *local_40;
  undefined4 *local_38;
  
  while (bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                  this)->
                 super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
                 super_DynamicTypeHandler.flags, (bVar1 & 4) != 0) {
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
  }
  if ((DAT_0145c35c == '\x01') &&
     (((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)this)->
       super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).field_0x28 & 6
      ) == 0)) {
    pSVar10 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
              ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                        ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)
                         this,instance);
    BVar7 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
            DeleteProperty_Internal<false>
                      (&pSVar10->
                        super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>,
                       instance,propertyId,propertyOperationFlags);
    return BVar7;
  }
  local_38 = (undefined4 *)CONCAT44(local_38._4_4_,propertyOperationFlags);
  pTVar11 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar11[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar1 & 0x10) != 0) || (*(char *)((long)&pTVar11[1].javascriptLibrary.ptr + 1) == '\x01'))
    {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x6ab,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar6) goto LAB_00c803f2;
      *puVar8 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar11 = (instance->super_RecyclableObject).type.ptr;
  }
  scriptContext =
       (((pTVar11->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  this_01 = scriptContext;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x6b3,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar6) goto LAB_00c803f2;
    *puVar8 = 0;
    this_01 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  }
  local_48 = ScriptContext::GetPropertyName(this_01,propertyId);
  bVar6 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                           *)this)->
                        super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                        ).propertyMap.ptr,&local_48,&local_40);
  uVar4 = DAT_0145c358;
  if (bVar6) {
    BVar7 = 1;
    if ((local_40->Attributes & 8) == 0) {
      if ((local_40->Attributes & 0x12) == 2) {
        if (local_40->propertyIndex != -1) {
          pRVar9 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
          bVar1 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                   this)->
                  super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
                  field_0x28;
          if ((0 < (int)DAT_0145c358 && (bVar1 & 2) == 0) &&
             (bVar12 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                          *)this)->
                       super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                       ).numDeletedProperties + 1,
             (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)this)
             ->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
             numDeletedProperties = bVar12, uVar4 <= bVar12)) {
            if (((bVar1 & 4) == 0) &&
               (pRVar9 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                                   (&instance->super_RecyclableObject,(RecyclableObject **)0x0),
               pRVar9 == (RecyclableObject *)0x0)) {
              bVar6 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
              PVar5 = (PropertyOperationFlags)local_38;
              if (bVar6) {
                Output::Print(
                             L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"
                             );
                Output::Flush();
              }
              pSVar10 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
                        ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                                  ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>
                                    *)this,instance);
              BVar7 = SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
                      DeleteProperty_Internal<false>
                                (&pSVar10->
                                  super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>
                                 ,instance,propertyId,PVar5);
              return BVar7;
            }
            bVar6 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
            PVar5 = (PropertyOperationFlags)local_38;
            if (bVar6) {
              Output::Print(
                           L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                           );
              Output::Flush();
            }
            this_00 = SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
                      ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,false>
                                ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>
                                  *)this,instance);
            BVar7 = DeleteProperty_Internal<false>
                              (&this_00->
                                super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
                               ,instance,propertyId,PVar5);
            return BVar7;
          }
          pRVar2 = (((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *
                     )this)->
                   super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
                   singletonInstance.ptr;
          if ((pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
             ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef != instance)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *local_38 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                        ,0x6f4,
                                        "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                        ,
                                        "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                       );
            if (!bVar6) {
LAB_00c803f2:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *local_38 = 0;
          }
          SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false>::
          InvalidateFixedField<Js::PropertyRecord_const*>
                    ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,false> *)this,
                     local_48,local_40,
                     (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr);
          if (((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                this)->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>
               ).super_DynamicTypeHandler.flags & 0x20) != 0) {
            ScriptContext::InvalidateProtoCaches(scriptContext,propertyId);
          }
          if ((((((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false> *)
                 this)->
                super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>).
                field_0x28 & 2) == 0) ||
             (bVar6 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>::
                      TryRegisterDeletedPropertyIndex
                                ((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_false>
                                  *)this,instance,local_40->propertyIndex), !bVar6)) {
            DynamicTypeHandler::SetSlotUnchecked(instance,local_40->propertyIndex,pRVar9);
          }
        }
        local_40->Attributes = '\x0e';
        if ((char)((instance->super_RecyclableObject).type.ptr)->flags < '\0') {
          DynamicObject::ChangeType(instance);
        }
        DynamicTypeHandler::SetPropertyUpdateSideEffect
                  (&this->super_DynamicTypeHandler,instance,propertyId,(Var)0x0,SideEffects_Any);
      }
      else {
        JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
                  ((PropertyOperationFlags)local_38,scriptContext,(PCWSTR)(local_48 + 1));
        BVar7 = 0;
      }
    }
  }
  else {
    bVar6 = DynamicObject::HasObjectArray(instance);
    if ((bVar6) && (local_48->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_48);
      BVar7 = DynamicTypeHandler::DeleteItem
                        (&this->super_DynamicTypeHandler,instance,index,
                         (PropertyOperationFlags)local_38);
    }
    else {
      BVar7 = 1;
    }
  }
  return BVar7;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty_Internal(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        if(!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            Assert(propertyId != Constants::NoProperty);
            PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
            if (propertyMap->TryGetReference(propertyRecord, &descriptor))
            {
                if (descriptor->Attributes & (PropertyDeleted | (!allowLetConstGlobal ? PropertyLetConstGlobal : 0)))
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable) ||
                    (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal)))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyRecord->GetBuffer());

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyId, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyRecord, descriptor, instance->GetScriptContext());
#endif

                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(propertyId);
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if(!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyId, nullptr, SideEffects_Any);
                return true;
            }

            // Check for a numeric propertyRecord only if objectArray available
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteItem(instance, propertyRecord->GetNumericValue(), propertyOperationFlags);
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty_Internal<allowLetConstGlobal>(instance, propertyId, propertyOperationFlags);
        }
        return true;
    }